

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O1

bool dxil_spv::is_canonically_normalizing_value(Value *value)

{
  bool bVar1;
  ValueKind VVar2;
  Instruction *pIVar3;
  Value *pVVar4;
  Value *pVVar5;
  LoggingCallback p_Var6;
  void *pvVar7;
  uint index;
  uint uVar8;
  uint index_00;
  char acStack_1038 [4104];
  
  bVar1 = value_is_dx_op_instrinsic(value,Rsqrt);
  if (bVar1) {
    pIVar3 = (Instruction *)LLVMBC::Internal::resolve_proxy(value);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)pIVar3);
    if (VVar2 != Call) {
      p_Var6 = get_thread_log_callback();
      if (p_Var6 == (LoggingCallback)0x0) {
        is_canonically_normalizing_value();
        std::terminate();
      }
      goto LAB_0016a463;
    }
    pVVar4 = LLVMBC::Instruction::getOperand(pIVar3,1);
    bVar1 = value_is_dx_op_instrinsic(pVVar4,Dot2);
    uVar8 = 2;
    if (!bVar1) {
      bVar1 = value_is_dx_op_instrinsic(pVVar4,Dot3);
      uVar8 = 3;
      if (!bVar1) {
        bVar1 = value_is_dx_op_instrinsic(pVVar4,Dot4);
        uVar8 = 4;
        if (!bVar1) goto LAB_0016a423;
      }
    }
    pIVar3 = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar4);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)pIVar3);
    if (VVar2 != Call) {
      p_Var6 = get_thread_log_callback();
      if (p_Var6 == (LoggingCallback)0x0) {
        is_canonically_normalizing_value();
        std::terminate();
      }
LAB_0016a463:
      builtin_strncpy(acStack_1038 + 0x10,"in cast<T>.\n",0xd);
      builtin_strncpy(acStack_1038,"Invalid type ID ",0x10);
      pvVar7 = get_thread_log_callback_userdata();
      (*p_Var6)(pvVar7,Error,acStack_1038);
      std::terminate();
    }
    index_00 = 1;
    index = uVar8;
    do {
      index = index + 1;
      bVar1 = index_00 - uVar8 == 1;
      if (bVar1) {
        return bVar1;
      }
      pVVar4 = LLVMBC::Instruction::getOperand(pIVar3,index_00);
      pVVar5 = LLVMBC::Instruction::getOperand(pIVar3,index);
      index_00 = index_00 + 1;
    } while (pVVar4 == pVVar5);
  }
  else {
LAB_0016a423:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool is_canonically_normalizing_value(const llvm::Value *value)
{
	return value_is_dx_op_instrinsic(value, DXIL::Op::Rsqrt) &&
	       value_is_length_squared(llvm::cast<llvm::CallInst>(value)->getOperand(1));
}